

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Options::TestCaseOptionParser::parseIntoConfig
          (TestCaseOptionParser *this,Command *cmd,ConfigData *config)

{
  ulong uVar1;
  size_t sVar2;
  string local_130;
  TestCaseFilter local_110;
  ulong local_e8;
  size_t i_1;
  TestCaseFilters filters;
  ulong local_48;
  size_t i;
  string groupName;
  ConfigData *config_local;
  Command *cmd_local;
  TestCaseOptionParser *this_local;
  
  groupName.field_2._8_8_ = config;
  std::__cxx11::string::string((string *)&i);
  local_48 = 0;
  while( true ) {
    sVar2 = Command::argsCount(cmd);
    if (sVar2 <= local_48) break;
    if (local_48 != 0) {
      std::__cxx11::string::operator+=((string *)&i," ");
    }
    Command::operator[][abi_cxx11_((string *)((long)&filters.m_name.field_2 + 8),cmd,local_48);
    std::__cxx11::string::operator+=
              ((string *)&i,(string *)(filters.m_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(filters.m_name.field_2._M_local_buf + 8));
    local_48 = local_48 + 1;
  }
  TestCaseFilters::TestCaseFilters((TestCaseFilters *)&i_1,(string *)&i);
  local_e8 = 0;
  while( true ) {
    uVar1 = local_e8;
    sVar2 = Command::argsCount(cmd);
    if (sVar2 <= uVar1) break;
    Command::operator[][abi_cxx11_(&local_130,cmd,local_e8);
    TestCaseFilter::TestCaseFilter(&local_110,&local_130,AutoDetectBehaviour);
    TestCaseFilters::addFilter((TestCaseFilters *)&i_1,&local_110);
    TestCaseFilter::~TestCaseFilter(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_e8 = local_e8 + 1;
  }
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
             (groupName.field_2._8_8_ + 0x48),(value_type *)&i_1);
  TestCaseFilters::~TestCaseFilters((TestCaseFilters *)&i_1);
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                std::string groupName;
                for( std::size_t i = 0; i < cmd.argsCount(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += cmd[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < cmd.argsCount(); ++i )
                    filters.addFilter( TestCaseFilter( cmd[i] ) );
                config.filters.push_back( filters );
            }